

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleAnsiPort(TokenKind kind)

{
  bool bVar1;
  bool local_f;
  bool local_9;
  TokenKind kind_local;
  
  if ((((((kind == Identifier) || (kind == OpenParenthesisStar)) || (kind == Comma)) ||
       ((kind == Dot || ((ushort)(kind - InOutKeyword) < 2)))) ||
      ((kind == InterfaceKeyword || ((kind == OutputKeyword || (kind == RefKeyword)))))) ||
     (kind == VarKeyword)) {
    local_9 = true;
  }
  else {
    bVar1 = isNetType(kind);
    local_f = true;
    if (!bVar1) {
      local_f = isPossibleDataType(kind);
    }
    local_9 = local_f;
  }
  return local_9;
}

Assistant:

bool SyntaxFacts::isPossibleAnsiPort(TokenKind kind) {
    switch (kind) {
        case TokenKind::InterfaceKeyword:
        case TokenKind::Identifier:
        case TokenKind::Dot:
        case TokenKind::Comma:
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
        case TokenKind::VarKeyword:
        case TokenKind::OpenParenthesisStar:
            return true;
        default:
            return isNetType(kind) || isPossibleDataType(kind);
    }
}